

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O1

void __thiscall
duckdb::RleBpDecoder::RleBpDecoder
          (RleBpDecoder *this,data_ptr_t buffer,uint32_t buffer_len,uint32_t bit_width)

{
  runtime_error *this_00;
  
  (this->buffer_).ptr = buffer;
  (this->buffer_).len = (ulong)buffer_len;
  this->bit_width_ = bit_width;
  this->bitpack_pos = '\0';
  this->current_value_ = 0;
  this->repeat_count_ = 0;
  this->literal_count_ = 0;
  if (bit_width < 0x40) {
    this->byte_encoded_len = (uint8_t)(bit_width + 7 >> 3);
    this->max_val = ~(-1L << ((byte)bit_width & 0x3f));
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"Decode bit width too large");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RleBpDecoder(data_ptr_t buffer, uint32_t buffer_len, uint32_t bit_width)
	    : buffer_(buffer, buffer_len), bit_width_(bit_width), current_value_(0), repeat_count_(0), literal_count_(0) {
		if (bit_width >= 64) {
			throw std::runtime_error("Decode bit width too large");
		}
		byte_encoded_len = ((bit_width_ + 7) / 8);
		max_val = (uint64_t(1) << bit_width_) - 1;
	}